

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O3

void av1_update_film_grain_parameters(AV1_COMP *cpi,AV1EncoderConfig *oxcf)

{
  int iVar1;
  SequenceHeader *pSVar2;
  long lVar3;
  aom_film_grain_table_t *t;
  
  if (cpi->film_grain_table != (aom_film_grain_table_t *)0x0) {
    aom_film_grain_table_free(cpi->film_grain_table);
    aom_free(cpi->film_grain_table);
    cpi->film_grain_table = (aom_film_grain_table_t *)0x0;
  }
  lVar3 = (long)(oxcf->tune_cfg).film_grain_test_vector;
  if (lVar3 == 0) {
    if ((oxcf->tune_cfg).film_grain_table_filename != (char *)0x0) {
      t = (aom_film_grain_table_t *)aom_calloc(1,0x10);
      cpi->film_grain_table = t;
      if (t == (aom_film_grain_table_t *)0x0) {
        aom_internal_error((cpi->common).error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate cpi->film_grain_table");
        t = cpi->film_grain_table;
      }
      aom_film_grain_table_read(t,(oxcf->tune_cfg).film_grain_table_filename,(cpi->common).error);
      return;
    }
    if ((oxcf->tune_cfg).content != AOM_CONTENT_FILM) {
      memset(&(cpi->common).film_grain_params,0,0x288);
      return;
    }
    pSVar2 = (cpi->common).seq_params;
    (cpi->common).film_grain_params.bit_depth = pSVar2->bit_depth;
    if ((oxcf->tool_cfg).enable_monochrome == true) {
      (cpi->common).film_grain_params.cr_mult = 0;
      (cpi->common).film_grain_params.cr_luma_mult = 0;
      (cpi->common).film_grain_params.cb_mult = 0;
      (cpi->common).film_grain_params.cb_luma_mult = 0;
      (cpi->common).film_grain_params.chroma_scaling_from_luma = 0;
      memset((cpi->common).film_grain_params.scaling_points_cb,0,0xa8);
      memset((cpi->common).film_grain_params.ar_coeffs_cb,0,200);
    }
    iVar1 = pSVar2->color_range;
  }
  else {
    if ((cpi->common).current_frame.frame_type != '\0') {
      return;
    }
    memcpy(&(cpi->common).film_grain_params,
           (void *)((long)default_switchable_interp_probs + lVar3 * 0x288 + 0x2d8),0x288);
    if ((oxcf->tool_cfg).enable_monochrome == true) {
      (cpi->common).film_grain_params.cr_mult = 0;
      (cpi->common).film_grain_params.cr_luma_mult = 0;
      (cpi->common).film_grain_params.cb_mult = 0;
      (cpi->common).film_grain_params.cb_luma_mult = 0;
      (cpi->common).film_grain_params.chroma_scaling_from_luma = 0;
      memset((cpi->common).film_grain_params.scaling_points_cb,0,0xa8);
      memset((cpi->common).film_grain_params.ar_coeffs_cb,0,200);
    }
    pSVar2 = (cpi->common).seq_params;
    (cpi->common).film_grain_params.bit_depth = pSVar2->bit_depth;
    iVar1 = pSVar2->color_range;
  }
  if (iVar1 == 1) {
    (cpi->common).film_grain_params.clip_to_restricted_range = 0;
  }
  return;
}

Assistant:

void av1_update_film_grain_parameters(struct AV1_COMP *cpi,
                                      const AV1EncoderConfig *oxcf) {
  AV1_COMMON *const cm = &cpi->common;
  const TuneCfg *const tune_cfg = &oxcf->tune_cfg;

  if (cpi->film_grain_table) {
    aom_film_grain_table_free(cpi->film_grain_table);
    aom_free(cpi->film_grain_table);
    cpi->film_grain_table = NULL;
  }

  if (tune_cfg->film_grain_test_vector) {
    if (cm->current_frame.frame_type == KEY_FRAME) {
      memcpy(&cm->film_grain_params,
             film_grain_test_vectors + tune_cfg->film_grain_test_vector - 1,
             sizeof(cm->film_grain_params));
      if (oxcf->tool_cfg.enable_monochrome)
        reset_film_grain_chroma_params(&cm->film_grain_params);
      cm->film_grain_params.bit_depth = cm->seq_params->bit_depth;
      if (cm->seq_params->color_range == AOM_CR_FULL_RANGE) {
        cm->film_grain_params.clip_to_restricted_range = 0;
      }
    }
  } else if (tune_cfg->film_grain_table_filename) {
    CHECK_MEM_ERROR(cm, cpi->film_grain_table,
                    aom_calloc(1, sizeof(*cpi->film_grain_table)));

    aom_film_grain_table_read(cpi->film_grain_table,
                              tune_cfg->film_grain_table_filename, cm->error);
  } else if (tune_cfg->content == AOM_CONTENT_FILM) {
    cm->film_grain_params.bit_depth = cm->seq_params->bit_depth;
    if (oxcf->tool_cfg.enable_monochrome)
      reset_film_grain_chroma_params(&cm->film_grain_params);
    if (cm->seq_params->color_range == AOM_CR_FULL_RANGE)
      cm->film_grain_params.clip_to_restricted_range = 0;
  } else {
    memset(&cm->film_grain_params, 0, sizeof(cm->film_grain_params));
  }
}